

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::ImageDataParameter::ImageDataParameter(ImageDataParameter *this,ImageDataParameter *from)

{
  void *pvVar1;
  bool bVar2;
  undefined3 uVar3;
  float fVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  bool bVar8;
  bool bVar9;
  undefined2 uVar10;
  uint32 uVar11;
  uint uVar12;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ImageDataParameter_00760e60;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar12 = (from->_has_bits_).has_bits_[0];
  if ((uVar12 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->source_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->source_).ptr_);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 & 2) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->mean_file_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->mean_file_).ptr_);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->root_folder_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar12 & 4) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->root_folder_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->root_folder_).ptr_);
  }
  uVar6 = from->crop_size_;
  uVar7 = from->rand_skip_;
  bVar8 = from->shuffle_;
  bVar9 = from->mirror_;
  uVar10 = *(undefined2 *)&from->field_0x3a;
  uVar11 = from->new_height_;
  bVar2 = from->is_color_;
  uVar3 = *(undefined3 *)&from->field_0x45;
  fVar4 = from->scale_;
  uVar5 = from->batch_size_;
  this->new_width_ = from->new_width_;
  this->is_color_ = bVar2;
  *(undefined3 *)&this->field_0x45 = uVar3;
  this->scale_ = fVar4;
  this->batch_size_ = uVar5;
  this->crop_size_ = uVar6;
  this->rand_skip_ = uVar7;
  this->shuffle_ = bVar8;
  this->mirror_ = bVar9;
  *(undefined2 *)&this->field_0x3a = uVar10;
  this->new_height_ = uVar11;
  return;
}

Assistant:

ImageDataParameter::ImageDataParameter(const ImageDataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source()) {
    source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
  }
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_mean_file()) {
    mean_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.mean_file_);
  }
  root_folder_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_root_folder()) {
    root_folder_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.root_folder_);
  }
  ::memcpy(&crop_size_, &from.crop_size_,
    reinterpret_cast<char*>(&batch_size_) -
    reinterpret_cast<char*>(&crop_size_) + sizeof(batch_size_));
  // @@protoc_insertion_point(copy_constructor:caffe.ImageDataParameter)
}